

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::microfacet::pdf(microfacet *this,vec3 *wi,vec3 *wo,void *user_args)

{
  float b;
  float_t fVar1;
  float_t fVar2;
  vec3 vVar3;
  float_t s;
  float_t D;
  float_t local_b8;
  undefined1 local_ac [8];
  vec3 wh;
  args args;
  float_t nrm;
  float_t local_48;
  undefined1 local_3c [8];
  vec3 tmp;
  void *user_args_local;
  vec3 *wo_local;
  vec3 *wi_local;
  microfacet *this_local;
  
  tmp._4_8_ = user_args;
  vVar3 = djb::operator+(wi,wo);
  stack0xffffffffffffffb0 = vVar3._0_8_;
  local_3c._0_4_ = args.detm;
  local_3c._4_4_ = nrm;
  local_48 = vVar3.z;
  tmp.x = local_48;
  unique0x10000149 = vVar3;
  args.minv.r[2].z = dot((vec3 *)local_3c,(vec3 *)local_3c);
  if (args.minv.r[2].z <= 0.0) {
    this_local._4_4_ = 0.0;
  }
  else {
    if (tmp._4_8_ == 0) {
      microfacet::args::standard();
    }
    else {
      memcpy(&wh.y,(void *)tmp._4_8_,0x4c);
    }
    b = inversesqrt<float>(&args.minv.r[2].z);
    vVar3 = djb::operator*((vec3 *)local_3c,b);
    _s = vVar3._0_8_;
    local_ac._0_4_ = s;
    local_ac._4_4_ = D;
    local_b8 = vVar3.z;
    wh.x = local_b8;
    fVar1 = ndf(this,(vec3 *)local_ac,(args *)&wh.y);
    fVar2 = sigma(this,wi,(args *)&wh.y);
    this_local._4_4_ = fVar1 / (fVar2 * 4.0);
  }
  return this_local._4_4_;
}

Assistant:

float_t
microfacet::pdf(const vec3 &wi, const vec3 &wo, const void *user_args) const
{
	vec3 tmp = wi + wo;
	float_t nrm = dot(tmp, tmp);

	if (/*wi.z > 0 &&*/ nrm > 0) {
		microfacet::args args =
			user_args ? *reinterpret_cast<const microfacet::args *>(user_args)
			          : microfacet::args::standard();
		vec3 wh = tmp * inversesqrt(nrm);
		float_t D = ndf(wh, args);
		float_t s = sigma(wi, args);

		return (D / (4 * s));
	}

	return 0;
}